

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ForVariableDeclarationSyntax::setChild
          (ForVariableDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  DeclaratorSyntax *pDVar2;
  Token TVar3;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pDVar2 = (DeclaratorSyntax *)0x0;
    }
    else {
      pDVar2 = (DeclaratorSyntax *)TokenOrSyntax::node(&child);
    }
    (this->declarator).ptr = pDVar2;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    this->type = (DataTypeSyntax *)pSVar1;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->varKeyword).kind = TVar3.kind;
    (this->varKeyword).field_0x2 = TVar3._2_1_;
    (this->varKeyword).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->varKeyword).rawLen = TVar3.rawLen;
    (this->varKeyword).info = TVar3.info;
  }
  return;
}

Assistant:

void ForVariableDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: varKeyword = child.token(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: declarator = child.node() ? &child.node()->as<DeclaratorSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}